

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

D_Sym * find_D_Sym_in_Scope_internal(D_Scope *st,char *name,int len,uint h)

{
  D_Scope **ppDVar1;
  D_SymHash *pDVar2;
  D_Scope *pDVar3;
  int iVar4;
  D_Sym *pDVar5;
  D_Sym **ppDVar6;
  
  do {
    if (st == (D_Scope *)0x0) {
      return (D_Sym *)0x0;
    }
    pDVar2 = st->hash;
    if (pDVar2 == (D_SymHash *)0x0) {
      ppDVar6 = &st->ll;
    }
    else {
      ppDVar6 = (pDVar2->syms).v + (ulong)h % (ulong)(pDVar2->syms).n;
    }
    for (pDVar5 = *ppDVar6; pDVar5 != (D_Sym *)0x0; pDVar5 = pDVar5->next) {
      if (((pDVar5->hash == h) && (pDVar5->len == len)) &&
         (iVar4 = strncmp(pDVar5->name,name,(long)len), iVar4 == 0)) {
        return pDVar5;
      }
    }
    if ((st->dynamic != (D_Scope *)0x0) &&
       (pDVar5 = find_D_Sym_in_Scope_internal(st->dynamic,name,len,h), pDVar5 != (D_Sym *)0x0)) {
      return pDVar5;
    }
    pDVar3 = st->search;
    if (pDVar3 == (D_Scope *)0x0) {
      return (D_Sym *)0x0;
    }
    ppDVar1 = &st->up;
    st = pDVar3;
  } while (pDVar3->up == *ppDVar1);
  return (D_Sym *)0x0;
}

Assistant:

static D_Sym *find_D_Sym_in_Scope_internal(D_Scope *st, char *name, int len, uint h) {
  D_Sym *ll;
  for (; st; st = st->search) {
    if (st->hash)
      ll = st->hash->syms.v[h % st->hash->syms.n];
    else
      ll = st->ll;
    while (ll) {
      if (ll->hash == h && ll->len == len && !strncmp(ll->name, name, len)) return ll;
      ll = ll->next;
    }
    if (st->dynamic)
      if ((ll = find_D_Sym_in_Scope_internal(st->dynamic, name, len, h))) return ll;
    if (!st->search || st->search->up != st->up) break;
  }
  return NULL;
}